

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_setmetatable(lua_State *L,int objindex)

{
  TValue *pTVar1;
  GCObject *local_28;
  Table *mt;
  TValue *obj;
  int objindex_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,objindex);
  if (L->top[-1].tt == 0) {
    local_28 = (GCObject *)0x0;
  }
  else {
    local_28 = L->top[-1].value.gc;
  }
  if (pTVar1->tt == 5) {
    (((pTVar1->value).gc)->h).metatable = (Table *)local_28;
    if (((local_28 != (GCObject *)0x0) && (((local_28->gch).marked & 3) != 0)) &&
       (((((pTVar1->value).gc)->gch).marked & 4) != 0)) {
      luaC_barrierback(L,&((pTVar1->value).gc)->h);
    }
  }
  else if (pTVar1->tt == 7) {
    (((pTVar1->value).gc)->h).metatable = (Table *)local_28;
    if (((local_28 != (GCObject *)0x0) && (((local_28->gch).marked & 3) != 0)) &&
       (((((pTVar1->value).gc)->gch).marked & 4) != 0)) {
      luaC_barrierf(L,(pTVar1->value).gc,local_28);
    }
  }
  else {
    L->l_G->mt[pTVar1->tt] = (Table *)local_28;
  }
  L->top = L->top + -1;
  return 1;
}

Assistant:

static int lua_setmetatable(lua_State*L,int objindex){
TValue*obj;
Table*mt;
api_checknelems(L,1);
obj=index2adr(L,objindex);
api_checkvalidindex(L,obj);
if(ttisnil(L->top-1))
mt=NULL;
else{
luai_apicheck(L,ttistable(L->top-1));
mt=hvalue(L->top-1);
}
switch(ttype(obj)){
case 5:{
hvalue(obj)->metatable=mt;
if(mt)
luaC_objbarriert(L,hvalue(obj),mt);
break;
}
case 7:{
uvalue(obj)->metatable=mt;
if(mt)
luaC_objbarrier(L,rawuvalue(obj),mt);
break;
}
default:{
G(L)->mt[ttype(obj)]=mt;
break;
}
}
L->top--;
return 1;
}